

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conjunction_filter.cpp
# Opt level: O2

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::ConjunctionAndFilter::ToExpression(ConjunctionAndFilter *this,Expression *column)

{
  unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> *puVar1;
  pointer pBVar2;
  pointer pTVar3;
  pointer *__ptr;
  unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> *this_00;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> local_48;
  undefined8 local_40;
  __uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_> local_38;
  
  local_48.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl._0_1_ = 0x32;
  local_38._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
       (tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
       (tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)this;
  make_uniq<duckdb::BoundConjunctionExpression,duckdb::ExpressionType>
            ((duckdb *)&local_40,(ExpressionType *)&local_48);
  puVar1 = (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> *)
           (column->super_BaseExpression).alias._M_string_length;
  for (this_00 = (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> *)
                 (column->super_BaseExpression).alias._M_dataplus._M_p; this_00 != puVar1;
      this_00 = this_00 + 1) {
    pBVar2 = unique_ptr<duckdb::BoundConjunctionExpression,_std::default_delete<duckdb::BoundConjunctionExpression>,_true>
             ::operator->((unique_ptr<duckdb::BoundConjunctionExpression,_std::default_delete<duckdb::BoundConjunctionExpression>,_true>
                           *)&local_40);
    pTVar3 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
             operator->(this_00);
    (*pTVar3->_vptr_TableFilter[6])(&local_48,pTVar3);
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                *)&pBVar2->children,&local_48);
    if ((long *)CONCAT71(local_48.
                         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                         ._M_t.
                         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl._1_7_,
                         local_48.
                         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                         ._M_t.
                         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl._0_1_) !=
        (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_48.
                                     super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                     ._M_t.
                                     super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                                     .super__Head_base<0UL,_duckdb::Expression_*,_false>.
                                     _M_head_impl._1_7_,
                                     local_48.
                                     super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                     ._M_t.
                                     super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                                     .super__Head_base<0UL,_duckdb::Expression_*,_false>.
                                     _M_head_impl._0_1_) + 8))();
    }
  }
  *(undefined8 *)
   local_38._M_t.
   super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
   super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = local_40;
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
         local_38._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<Expression> ConjunctionAndFilter::ToExpression(const Expression &column) const {
	auto conjunction = make_uniq<BoundConjunctionExpression>(ExpressionType::CONJUNCTION_AND);
	for (auto &filter : child_filters) {
		conjunction->children.push_back(filter->ToExpression(column));
	}
	return std::move(conjunction);
}